

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_fill_poly_convex
               (nk_draw_list *list,nk_vec2 *points,uint points_count,nk_color color,
               nk_anti_aliasing aliasing)

{
  nk_convert_config *config;
  undefined8 uVar1;
  undefined8 uVar2;
  nk_vec2 uv;
  nk_buffer *pnVar3;
  void *pvVar4;
  nk_size nVar5;
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  nk_draw_index nVar10;
  int iVar11;
  void *pvVar12;
  nk_draw_index *pnVar13;
  void *pvVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  nk_size nVar18;
  nk_draw_index nVar19;
  float fVar20;
  ulong uVar21;
  ulong uVar22;
  nk_draw_index nVar23;
  uint uVar24;
  nk_vec2 pos;
  nk_vec2 pos_00;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  
  if (2 < points_count && list != (nk_draw_list *)0x0) {
    config = &list->config;
    iVar11 = (int)((float)((uint)color >> 0x18) * (list->config).global_alpha);
    fVar25 = (float)((uint)color & 0xff) * 0.003921569;
    fVar27 = (float)((uint)color >> 8 & 0xff) * 0.003921569;
    auVar6[0xc] = (char)((uint)iVar11 >> 0x10);
    auVar6._0_12_ = ZEXT812(0);
    auVar7._10_3_ = auVar6._10_3_;
    auVar7._0_10_ = (unkuint10)(byte)((uint)iVar11 >> 8) << 0x40;
    auVar9._5_8_ = 0;
    auVar9._0_5_ = auVar7._8_5_;
    auVar8[5] = 0;
    auVar8._0_5_ = CONCAT14((char)iVar11,(uint)color >> 0x10) & 0xff000000ff;
    auVar8._6_7_ = SUB137(auVar9 << 0x40,6);
    fVar26 = (float)((uint)color >> 0x10 & 0xff) * 0.003921569;
    fVar28 = (float)auVar8._4_4_ * 0.003921569;
    uVar24 = list->vertex_count;
    nVar19 = (nk_draw_index)uVar24;
    if (aliasing == NK_ANTI_ALIASING_ON) {
      pvVar12 = nk_draw_list_alloc_vertices(list,(ulong)(points_count * 2));
      pnVar13 = nk_draw_list_alloc_elements(list,(ulong)(points_count * 9 - 6));
      if (pnVar13 != (nk_draw_index *)0x0 && pvVar12 != (void *)0x0) {
        pnVar3 = list->vertices;
        if (pnVar3 != (nk_buffer *)0x0) {
          pnVar3->marker[0].active = 1;
          pnVar3->marker[0].offset = pnVar3->allocated;
        }
        pvVar4 = (pnVar3->memory).ptr;
        uVar22 = (ulong)points_count;
        pvVar14 = nk_buffer_alloc(pnVar3,NK_BUFFER_FRONT,uVar22 * 8,4);
        if (pvVar14 != (void *)0x0) {
          pvVar12 = (void *)((long)pvVar12 + ((long)(list->vertices->memory).ptr - (long)pvVar4));
          if (2 < points_count) {
            lVar15 = uVar22 - 2;
            iVar11 = uVar24 + 2;
            do {
              *pnVar13 = nVar19;
              pnVar13[1] = (nk_draw_index)iVar11;
              iVar11 = iVar11 + 2;
              pnVar13[2] = (nk_draw_index)iVar11;
              pnVar13 = pnVar13 + 3;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
          }
          if (points_count != 0) {
            uVar21 = 0;
            uVar17 = (ulong)(points_count - 1);
            do {
              uVar16 = uVar21;
              fVar30 = points[uVar16].x - points[uVar17].x;
              fVar29 = points[uVar16].y - points[uVar17].y;
              fVar31 = fVar30 * fVar30 + fVar29 * fVar29;
              fVar20 = 1.0;
              if ((fVar31 != 0.0) || (NAN(fVar31))) {
                fVar20 = (float)(0x5f375a84 - ((uint)fVar31 >> 1));
                fVar20 = (fVar31 * -0.5 * fVar20 * fVar20 + 1.5) * fVar20;
              }
              *(ulong *)((long)pvVar14 + uVar17 * 8) = CONCAT44(fVar20 * -fVar30,fVar20 * fVar29);
              uVar21 = uVar16 + 1;
              uVar17 = uVar16;
            } while (uVar22 != uVar16 + 1);
            uVar21 = (ulong)(points_count - 1);
            uVar17 = 0;
            do {
              uVar1 = *(undefined8 *)((long)pvVar14 + uVar21 * 8);
              uVar2 = *(undefined8 *)((long)pvVar14 + uVar17 * 8);
              fVar29 = ((float)uVar2 + (float)uVar1) * 0.5;
              fVar30 = ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
              fVar20 = fVar29 * fVar29 + fVar30 * fVar30;
              if (1e-06 < fVar20) {
                fVar20 = 1.0 / fVar20;
                if (100.0 <= fVar20) {
                  fVar20 = 100.0;
                }
                fVar29 = fVar29 * fVar20;
                fVar30 = fVar30 * fVar20;
              }
              color_01.g = fVar27;
              color_01.r = fVar25;
              color_01.a = fVar28;
              color_01.b = fVar26;
              uv = (list->config).null.uv;
              pos.x = points[uVar17].x - fVar29 * 0.5;
              pos.y = points[uVar17].y - fVar30 * 0.5;
              pvVar12 = nk_draw_vertex(pvVar12,config,pos,uv,color_01);
              pos_00.x = points[uVar17].x + fVar29 * 0.5;
              pos_00.y = points[uVar17].y + fVar30 * 0.5;
              color_02.g = fVar27;
              color_02.r = fVar25;
              color_02.b = fVar26;
              color_02.a = 0.0;
              pvVar12 = nk_draw_vertex(pvVar12,config,pos_00,uv,color_02);
              nVar23 = (nk_draw_index)uVar24;
              *pnVar13 = nVar23;
              pnVar13[1] = nVar19 + (short)uVar21 * 2;
              nVar10 = nVar19 + 1 + (short)uVar21 * 2;
              pnVar13[2] = nVar10;
              pnVar13[3] = nVar10;
              pnVar13[4] = nVar23 + 1;
              pnVar13[5] = nVar23;
              pnVar13 = pnVar13 + 6;
              uVar16 = uVar17 + 1;
              uVar24 = uVar24 + 2;
              uVar21 = uVar17;
              uVar17 = uVar16;
            } while (uVar22 != uVar16);
          }
          pnVar3 = list->vertices;
          if (pnVar3 != (nk_buffer *)0x0) {
            nVar5 = pnVar3->marker[0].offset;
            pnVar3->needed = pnVar3->needed + (nVar5 - pnVar3->allocated);
            nVar18 = 0;
            if (pnVar3->marker[0].active != 0) {
              nVar18 = nVar5;
            }
            pnVar3->allocated = nVar18;
            pnVar3->marker[0].active = 0;
          }
        }
      }
    }
    else {
      uVar22 = (ulong)points_count;
      pvVar12 = nk_draw_list_alloc_vertices(list,uVar22);
      pnVar13 = nk_draw_list_alloc_elements(list,(ulong)(points_count * 3 - 6));
      if (pnVar13 != (nk_draw_index *)0x0 && pvVar12 != (void *)0x0) {
        if (points_count != 0) {
          uVar21 = 0;
          do {
            color_00.g = fVar27;
            color_00.r = fVar25;
            color_00.a = fVar28;
            color_00.b = fVar26;
            pvVar12 = nk_draw_vertex(pvVar12,config,points[uVar21],(list->config).null.uv,color_00);
            uVar21 = uVar21 + 1;
          } while (uVar22 != uVar21);
        }
        if (2 < points_count) {
          iVar11 = uVar24 + 2;
          lVar15 = 0;
          do {
            *(nk_draw_index *)((long)pnVar13 + lVar15) = nVar19;
            *(short *)((long)pnVar13 + lVar15 + 2) = (short)iVar11 + -1;
            *(short *)((long)pnVar13 + lVar15 + 4) = (short)iVar11;
            lVar15 = lVar15 + 6;
            iVar11 = iVar11 + 1;
          } while (uVar22 * 6 + -0xc != lVar15);
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_poly_convex(struct nk_draw_list *list,
const struct nk_vec2 *points, const unsigned int points_count,
struct nk_color color, enum nk_anti_aliasing aliasing)
{
struct nk_colorf col;
struct nk_colorf col_trans;

NK_STORAGE const nk_size pnt_align = NK_ALIGNOF(struct nk_vec2);
NK_STORAGE const nk_size pnt_size = sizeof(struct nk_vec2);
NK_ASSERT(list);
if (!list || points_count < 3) return;

#ifdef NK_INCLUDE_COMMAND_USERDATA
nk_draw_list_push_userdata(list, list->userdata);
#endif

color.a = (nk_byte)((float)color.a * list->config.global_alpha);
nk_color_fv(&col.r, color);
col_trans = col;
col_trans.a = 0;

if (aliasing == NK_ANTI_ALIASING_ON) {
nk_size i = 0;
nk_size i0 = 0;
nk_size i1 = 0;

const float AA_SIZE = 1.0f;
nk_size vertex_offset = 0;
nk_size index = list->vertex_count;

const nk_size idx_count = (points_count-2)*3 + points_count*6;
const nk_size vtx_count = (points_count*2);

void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

nk_size size = 0;
struct nk_vec2 *normals = 0;
unsigned int vtx_inner_idx = (unsigned int)(index + 0);
unsigned int vtx_outer_idx = (unsigned int)(index + 1);
if (!vtx || !ids) return;

/* temporary allocate normals */
vertex_offset = (nk_size)((nk_byte*)vtx - (nk_byte*)list->vertices->memory.ptr);
nk_buffer_mark(list->vertices, NK_BUFFER_FRONT);
size = pnt_size * points_count;
normals = (struct nk_vec2*) nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT, size, pnt_align);
if (!normals) return;
vtx = (void*)((nk_byte*)list->vertices->memory.ptr + vertex_offset);

/* add elements */
for (i = 2; i < points_count; i++) {
ids[0] = (nk_draw_index)(vtx_inner_idx);
ids[1] = (nk_draw_index)(vtx_inner_idx + ((i-1) << 1));
ids[2] = (nk_draw_index)(vtx_inner_idx + (i << 1));
ids += 3;
}

/* compute normals */
for (i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++) {
struct nk_vec2 p0 = points[i0];
struct nk_vec2 p1 = points[i1];
struct nk_vec2 diff = nk_vec2_sub(p1, p0);

/* vec2 inverted length  */
float len = nk_vec2_len_sqr(diff);
if (len != 0.0f)
len = nk_inv_sqrt(len);
else len = 1.0f;
diff = nk_vec2_muls(diff, len);

normals[i0].x = diff.y;
normals[i0].y = -diff.x;
}

/* add vertices + indexes */
for (i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++) {
const struct nk_vec2 uv = list->config.null.uv;
struct nk_vec2 n0 = normals[i0];
struct nk_vec2 n1 = normals[i1];
struct nk_vec2 dm = nk_vec2_muls(nk_vec2_add(n0, n1), 0.5f);
float dmr2 = dm.x*dm.x + dm.y*dm.y;
if (dmr2 > 0.000001f) {
float scale = 1.0f / dmr2;
scale = NK_MIN(scale, 100.0f);
dm = nk_vec2_muls(dm, scale);
}
dm = nk_vec2_muls(dm, AA_SIZE * 0.5f);

/* add vertices */
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2_sub(points[i1], dm), uv, col);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2_add(points[i1], dm), uv, col_trans);

/* add indexes */
ids[0] = (nk_draw_index)(vtx_inner_idx+(i1<<1));
ids[1] = (nk_draw_index)(vtx_inner_idx+(i0<<1));
ids[2] = (nk_draw_index)(vtx_outer_idx+(i0<<1));
ids[3] = (nk_draw_index)(vtx_outer_idx+(i0<<1));
ids[4] = (nk_draw_index)(vtx_outer_idx+(i1<<1));
ids[5] = (nk_draw_index)(vtx_inner_idx+(i1<<1));
ids += 6;
}
/* free temporary normals + points */
nk_buffer_reset(list->vertices, NK_BUFFER_FRONT);
} else {
nk_size i = 0;
nk_size index = list->vertex_count;
const nk_size idx_count = (points_count-2)*3;
const nk_size vtx_count = points_count;
void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

if (!vtx || !ids) return;
for (i = 0; i < vtx_count; ++i)
vtx = nk_draw_vertex(vtx, &list->config, points[i], list->config.null.uv, col);
for (i = 2; i < points_count; ++i) {
ids[0] = (nk_draw_index)index;
ids[1] = (nk_draw_index)(index+ i - 1);
ids[2] = (nk_draw_index)(index+i);
ids += 3;
}
}
}